

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_set_svc_seq_params(AV1_PRIMARY *ppi)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if ((ppi->seq_params).operating_points_cnt_minus_1 == 0) {
    (ppi->seq_params).operating_point_idc[0] = 0;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (ppi->number_spatial_layers != 0) {
      uVar4 = 0;
      iVar5 = 0;
      do {
        uVar1 = ppi->number_temporal_layers;
        if (uVar1 != 0) {
          cVar3 = '\0';
          lVar6 = 0;
          do {
            (ppi->seq_params).operating_point_idc[iVar5 + lVar6] =
                 ~(-1 << ((char)uVar1 + cVar3 & 0x1fU)) |
                 ~(-1 << ((char)ppi->number_spatial_layers - (char)uVar4 & 0x1fU)) << 8;
            uVar1 = ppi->number_temporal_layers;
            lVar6 = lVar6 + 1;
            cVar3 = cVar3 + -1;
          } while ((uint)lVar6 < uVar1);
          iVar5 = iVar5 + (uint)lVar6;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < ppi->number_spatial_layers);
    }
  }
  (ppi->seq_params).has_nonzero_operating_point_idc = bVar2;
  return;
}

Assistant:

void av1_set_svc_seq_params(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq = &ppi->seq_params;
  if (seq->operating_points_cnt_minus_1 == 0) {
    seq->operating_point_idc[0] = 0;
    seq->has_nonzero_operating_point_idc = false;
  } else {
    // Set operating_point_idc[] such that the i=0 point corresponds to the
    // highest quality operating point (all layers), and subsequent
    // operarting points (i > 0) are lower quality corresponding to
    // skip decoding enhancement  layers (temporal first).
    int i = 0;
    assert(seq->operating_points_cnt_minus_1 ==
           (int)(ppi->number_spatial_layers * ppi->number_temporal_layers - 1));
    for (unsigned int sl = 0; sl < ppi->number_spatial_layers; sl++) {
      for (unsigned int tl = 0; tl < ppi->number_temporal_layers; tl++) {
        seq->operating_point_idc[i] =
            (~(~0u << (ppi->number_spatial_layers - sl)) << 8) |
            ~(~0u << (ppi->number_temporal_layers - tl));
        assert(seq->operating_point_idc[i] != 0);
        i++;
      }
    }
    seq->has_nonzero_operating_point_idc = true;
  }
}